

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_input_parser.cpp
# Opt level: O3

Output * __thiscall
ftxui::TerminalInputParser::ParseMouse
          (Output *__return_storage_ptr__,TerminalInputParser *this,bool altered,bool pressed,
          vector<int,_std::allocator<int>_> *arguments)

{
  Button BVar1;
  Button *pBVar2;
  Type TVar3;
  
  pBVar2 = (Button *)
           (arguments->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  TVar3 = SPECIAL;
  if ((long)(arguments->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pBVar2 == 0xc) {
    BVar1 = *pBVar2;
    (__return_storage_ptr__->field_1).mouse.button = BVar1 >> 4 & WheelUp | BVar1 & None;
    *(uint *)((long)&__return_storage_ptr__->field_1 + 4) = (uint)pressed;
    (__return_storage_ptr__->field_1).mouse.shift = (bool)((byte)BVar1 >> 2 & 1);
    (__return_storage_ptr__->field_1).mouse.meta = (bool)((byte)BVar1 >> 3 & 1);
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0xc) = *(undefined8 *)(pBVar2 + 1);
    TVar3 = MOUSE;
  }
  __return_storage_ptr__->type = TVar3;
  return __return_storage_ptr__;
}

Assistant:

TerminalInputParser::Output TerminalInputParser::ParseMouse(
    bool altered,
    bool pressed,
    std::vector<int> arguments) {
  if (arguments.size() != 3)
    return SPECIAL;

  (void)altered;

  Output output(MOUSE);
  output.mouse.button = Mouse::Button((arguments[0] & 3) +  //
                                      ((arguments[0] & 64) >> 4));
  output.mouse.motion = Mouse::Motion(pressed);
  output.mouse.shift = bool(arguments[0] & 4);
  output.mouse.meta = bool(arguments[0] & 8);
  output.mouse.x = arguments[1];
  output.mouse.y = arguments[2];
  return output;
}